

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityPrintFloat(UNITY_DOUBLE input_number)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *string;
  double dVar6;
  double dVar7;
  
  if (input_number < 0.0) {
    putchar(0x2d);
    input_number = -input_number;
  }
  if (NAN(input_number)) {
    string = "NaN";
  }
  else {
    if (ABS(input_number) == INFINITY) {
      UnityPrintLen("Infinity",3);
      return;
    }
    if ((5e-07 < input_number) || (input_number <= 0.0)) {
      if (4294967295.9999995 <= input_number) {
        dVar6 = input_number / 10.0;
        uVar5 = 9;
        if (999999999.5 <= dVar6) {
          dVar7 = 10.0;
          do {
            dVar7 = dVar7 * 10.0;
            uVar5 = uVar5 + 1;
            dVar6 = input_number / dVar7;
          } while (999999999.5 <= dVar6);
        }
        uVar3 = (uint)(dVar6 + 0.5);
        uVar4 = uVar3;
        if ((dVar6 < (double)(int)(dVar6 + 0.5)) && (dVar6 - (double)(int)(uVar3 - 1) <= 0.5)) {
          uVar4 = uVar3 - 1;
          if ((uVar3 & 1) == 0) {
            uVar4 = uVar3;
          }
          if (1e+22 <= input_number) {
            uVar4 = uVar3;
          }
        }
        iVar2 = (int)uVar4 >> 0x1f;
        iVar1 = (int)uVar4 / 100000000 + iVar2;
        putchar((iVar1 - iVar2) + 0x30);
        UnityPrintDecimalAndNumberWithLeadingZeros(uVar4 + (iVar1 - iVar2) * -100000000,10000000);
        putchar(0x65);
        putchar(0x2b);
        if (uVar5 < 10) {
          putchar(0x30);
        }
        UnityPrintNumber((ulong)uVar5);
        return;
      }
      dVar6 = (input_number - (double)((long)input_number & 0xffffffff)) * 1000000.0;
      uVar4 = (uint)(dVar6 + 0.5);
      uVar5 = uVar4;
      if ((dVar6 < (double)(int)(dVar6 + 0.5)) && (dVar6 - (double)(int)(uVar4 - 1) <= 0.5)) {
        uVar5 = uVar4 - 1;
        if ((uVar4 & 1) == 0) {
          uVar5 = uVar4;
        }
        if (1e+22 <= input_number) {
          uVar5 = uVar4;
        }
      }
      uVar4 = 0;
      if (uVar5 != 1000000) {
        uVar4 = uVar5;
      }
      UnityPrintNumberUnsigned((ulong)((uint)(uVar5 == 1000000) + (int)(long)input_number));
      UnityPrintDecimalAndNumberWithLeadingZeros(uVar4,100000);
      return;
    }
    string = "0.000000...";
  }
  UnityPrint(string);
  return;
}

Assistant:

void UnityPrintFloat(const UNITY_DOUBLE input_number)
{
    UNITY_DOUBLE number;

    if (input_number < 0)
    {
        UNITY_OUTPUT_CHAR('-');
        number = -input_number;
    } else
    {
        number = input_number;
    }

    if (isnan(number)) UnityPrint(UnityStrNaN);
    else if (isinf(number)) UnityPrintLen(UnityStrInf, 3);
    else if (number <= 0.0000005 && number > 0) UnityPrint("0.000000..."); /* Small number */
    else if (number < 4294967295.9999995) /* Rounded result fits in 32 bits, "%.6f" format */
    {
        const UNITY_INT32 divisor = 1000000/10;
        UNITY_UINT32 integer_part = (UNITY_UINT32)number;
        UNITY_INT32 fraction_part = (UNITY_INT32)((number - (UNITY_DOUBLE)integer_part)*1000000.0 + 0.5);
        /* Double precision calculation gives best performance for six rounded decimal places */
        ROUND_TIES_TO_EVEN(number, fraction_part, (number - (UNITY_DOUBLE)integer_part)*1000000.0);

        if (fraction_part == 1000000) /* Carry across the decimal point */
        {
            fraction_part = 0;
            integer_part += 1;
        }

        UnityPrintNumberUnsigned(integer_part);
        UnityPrintDecimalAndNumberWithLeadingZeros(fraction_part, divisor);
    }
    else /* Number is larger, use exponential format of 9 digits, "%.8e" */
    {
        const UNITY_INT32 divisor = 1000000000/10;
        UNITY_INT32 integer_part;
        UNITY_DOUBLE_TYPE divide = 10.0;
        int exponent = 9;

        while (number / divide >= 1000000000.0 - 0.5)
        {
            divide *= 10;
            exponent++;
        }
        integer_part = (UNITY_INT32)(number / divide + 0.5);
        /* Double precision calculation required for float, to produce 9 rounded digits */
        ROUND_TIES_TO_EVEN(number, integer_part, number / divide);

        UNITY_OUTPUT_CHAR('0' + integer_part / divisor);
        UnityPrintDecimalAndNumberWithLeadingZeros(integer_part % divisor, divisor / 10);
        UNITY_OUTPUT_CHAR('e');
        UNITY_OUTPUT_CHAR('+');
        if (exponent < 10) UNITY_OUTPUT_CHAR('0');
        UnityPrintNumber(exponent);
    }
}